

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  byte bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined4 uVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined4 uVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  long lVar74;
  uint uVar75;
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  long lVar84;
  bool bVar85;
  float fVar86;
  float fVar92;
  undefined1 auVar87 [16];
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar151;
  uint uVar152;
  float fVar157;
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  uint uVar158;
  uint uVar160;
  float fVar161;
  uint uVar162;
  undefined1 auVar155 [16];
  float fVar163;
  uint uVar164;
  float fVar165;
  uint uVar166;
  float fVar167;
  uint uVar168;
  undefined1 auVar156 [32];
  uint uVar169;
  float fVar170;
  float fVar173;
  float fVar174;
  undefined1 auVar171 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [32];
  float fVar179;
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [32];
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar200 [32];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined1 local_16e0 [16];
  undefined1 (*local_16d0) [16];
  ulong local_16c8;
  ulong local_16c0;
  ulong local_16b8;
  ulong local_16b0;
  ulong local_16a8;
  ulong local_16a0;
  ulong *local_1698;
  ulong local_1690;
  ulong local_1688;
  ulong local_1680;
  ulong local_1678;
  ulong local_1670;
  ulong local_1668;
  long local_1660;
  long local_1658;
  ulong local_1650;
  ulong local_1648;
  long local_1640;
  long local_1638;
  RTCFilterFunctionNArguments local_1630;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  undefined1 local_15e0 [16];
  undefined1 auStack_15d0 [16];
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [32];
  float local_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float local_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined1 local_14b0 [16];
  uint local_14a0;
  uint uStack_149c;
  uint uStack_1498;
  uint uStack_1494;
  uint uStack_1490;
  uint uStack_148c;
  uint uStack_1488;
  uint uStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1698 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13a0._4_4_ = uVar1;
  local_13a0._0_4_ = uVar1;
  local_13a0._8_4_ = uVar1;
  local_13a0._12_4_ = uVar1;
  local_13a0._16_4_ = uVar1;
  local_13a0._20_4_ = uVar1;
  local_13a0._24_4_ = uVar1;
  local_13a0._28_4_ = uVar1;
  auVar181 = ZEXT3264(local_13a0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = uVar1;
  local_13c0._0_4_ = uVar1;
  local_13c0._8_4_ = uVar1;
  local_13c0._12_4_ = uVar1;
  local_13c0._16_4_ = uVar1;
  local_13c0._20_4_ = uVar1;
  local_13c0._24_4_ = uVar1;
  local_13c0._28_4_ = uVar1;
  auVar189 = ZEXT3264(local_13c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13e0._4_4_ = uVar1;
  local_13e0._0_4_ = uVar1;
  local_13e0._8_4_ = uVar1;
  local_13e0._12_4_ = uVar1;
  local_13e0._16_4_ = uVar1;
  local_13e0._20_4_ = uVar1;
  local_13e0._24_4_ = uVar1;
  local_13e0._28_4_ = uVar1;
  auVar191 = ZEXT3264(local_13e0);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar92 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar77 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar80 = uVar77 ^ 0x20;
  uVar72 = uVar78 ^ 0x20;
  uVar82 = uVar79 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_1580._4_4_ = iVar2;
  local_1580._0_4_ = iVar2;
  local_1580._8_4_ = iVar2;
  local_1580._12_4_ = iVar2;
  local_1580._16_4_ = iVar2;
  local_1580._20_4_ = iVar2;
  local_1580._24_4_ = iVar2;
  local_1580._28_4_ = iVar2;
  auVar128 = ZEXT3264(local_1580);
  iVar2 = (tray->tfar).field_0.i[k];
  local_15a0._4_4_ = iVar2;
  local_15a0._0_4_ = iVar2;
  local_15a0._8_4_ = iVar2;
  local_15a0._12_4_ = iVar2;
  local_15a0._16_4_ = iVar2;
  local_15a0._20_4_ = iVar2;
  local_15a0._24_4_ = iVar2;
  local_15a0._28_4_ = iVar2;
  auVar133 = ZEXT3264(local_15a0);
  local_1668 = uVar77 >> 2;
  local_1670 = uVar80 >> 2;
  local_1440._0_16_ = mm_lookupmask_ps._0_16_;
  local_1440._16_16_ = mm_lookupmask_ps._240_16_;
  local_16d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1678 = uVar78 >> 2;
  local_1680 = uVar72 >> 2;
  local_1688 = uVar79 >> 2;
  local_1690 = uVar82 >> 2;
  auVar101._8_4_ = 0xbf800000;
  auVar101._0_8_ = 0xbf800000bf800000;
  auVar101._12_4_ = 0xbf800000;
  auVar101._16_4_ = 0xbf800000;
  auVar101._20_4_ = 0xbf800000;
  auVar101._24_4_ = 0xbf800000;
  auVar101._28_4_ = 0xbf800000;
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  _local_1460 = vblendvps_avx(auVar109,auVar101,local_1440);
  bVar85 = true;
  fVar93 = fVar92;
  fVar95 = fVar92;
  fVar97 = fVar92;
  fVar94 = fVar92;
  fVar96 = fVar92;
  fVar90 = fVar92;
  fVar193 = fVar86;
  fVar194 = fVar86;
  fVar195 = fVar86;
  fVar196 = fVar86;
  fVar197 = fVar86;
  fVar198 = fVar86;
  fVar201 = fVar91;
  fVar203 = fVar91;
  fVar205 = fVar91;
  fVar207 = fVar91;
  fVar209 = fVar91;
  fVar211 = fVar91;
  local_16c8 = uVar82;
  local_16c0 = uVar72;
  local_16b8 = uVar80;
  local_16b0 = uVar79;
  local_16a8 = uVar78;
  local_16a0 = uVar77;
  local_1560 = fVar92;
  fStack_155c = fVar92;
  fStack_1558 = fVar92;
  fStack_1554 = fVar92;
  fStack_1550 = fVar92;
  fStack_154c = fVar92;
  fStack_1548 = fVar92;
  fStack_1544 = fVar92;
  local_1420 = fVar91;
  fStack_141c = fVar91;
  fStack_1418 = fVar91;
  fStack_1414 = fVar91;
  fStack_1410 = fVar91;
  fStack_140c = fVar91;
  fStack_1408 = fVar91;
  fStack_1404 = fVar91;
  local_1400 = fVar86;
  fStack_13fc = fVar86;
  fStack_13f8 = fVar86;
  fStack_13f4 = fVar86;
  fStack_13f0 = fVar86;
  fStack_13ec = fVar86;
  fStack_13e8 = fVar86;
  fStack_13e4 = fVar86;
  do {
    uVar81 = local_1698[-1];
    local_1698 = local_1698 + -1;
    while ((uVar81 & 8) == 0) {
      auVar101 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar77),auVar181._0_32_);
      auVar9._4_4_ = fVar193 * auVar101._4_4_;
      auVar9._0_4_ = fVar86 * auVar101._0_4_;
      auVar9._8_4_ = fVar194 * auVar101._8_4_;
      auVar9._12_4_ = fVar195 * auVar101._12_4_;
      auVar9._16_4_ = fVar196 * auVar101._16_4_;
      auVar9._20_4_ = fVar197 * auVar101._20_4_;
      auVar9._24_4_ = fVar198 * auVar101._24_4_;
      auVar9._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar78),auVar189._0_32_);
      auVar41._4_4_ = fVar201 * auVar101._4_4_;
      auVar41._0_4_ = fVar91 * auVar101._0_4_;
      auVar41._8_4_ = fVar203 * auVar101._8_4_;
      auVar41._12_4_ = fVar205 * auVar101._12_4_;
      auVar41._16_4_ = fVar207 * auVar101._16_4_;
      auVar41._20_4_ = fVar209 * auVar101._20_4_;
      auVar41._24_4_ = fVar211 * auVar101._24_4_;
      auVar41._28_4_ = auVar101._28_4_;
      auVar101 = vmaxps_avx(auVar9,auVar41);
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar79),auVar191._0_32_);
      auVar42._4_4_ = fVar93 * auVar109._4_4_;
      auVar42._0_4_ = fVar92 * auVar109._0_4_;
      auVar42._8_4_ = fVar95 * auVar109._8_4_;
      auVar42._12_4_ = fVar97 * auVar109._12_4_;
      auVar42._16_4_ = fVar94 * auVar109._16_4_;
      auVar42._20_4_ = fVar96 * auVar109._20_4_;
      auVar42._24_4_ = fVar90 * auVar109._24_4_;
      auVar42._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar80),auVar181._0_32_);
      auVar43._4_4_ = fVar193 * auVar109._4_4_;
      auVar43._0_4_ = fVar86 * auVar109._0_4_;
      auVar43._8_4_ = fVar194 * auVar109._8_4_;
      auVar43._12_4_ = fVar195 * auVar109._12_4_;
      auVar43._16_4_ = fVar196 * auVar109._16_4_;
      auVar43._20_4_ = fVar197 * auVar109._20_4_;
      auVar43._24_4_ = fVar198 * auVar109._24_4_;
      auVar43._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar72),auVar189._0_32_);
      auVar44._4_4_ = fVar201 * auVar109._4_4_;
      auVar44._0_4_ = fVar91 * auVar109._0_4_;
      auVar44._8_4_ = fVar203 * auVar109._8_4_;
      auVar44._12_4_ = fVar205 * auVar109._12_4_;
      auVar44._16_4_ = fVar207 * auVar109._16_4_;
      auVar44._20_4_ = fVar209 * auVar109._20_4_;
      auVar44._24_4_ = fVar211 * auVar109._24_4_;
      auVar44._28_4_ = auVar109._28_4_;
      auVar9 = vminps_avx(auVar43,auVar44);
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar81 + 0x40 + uVar82),auVar191._0_32_);
      auVar45._4_4_ = fVar93 * auVar109._4_4_;
      auVar45._0_4_ = fVar92 * auVar109._0_4_;
      auVar45._8_4_ = fVar95 * auVar109._8_4_;
      auVar45._12_4_ = fVar97 * auVar109._12_4_;
      auVar45._16_4_ = fVar94 * auVar109._16_4_;
      auVar45._20_4_ = fVar96 * auVar109._20_4_;
      auVar45._24_4_ = fVar90 * auVar109._24_4_;
      auVar45._28_4_ = auVar109._28_4_;
      auVar109 = vmaxps_avx(auVar42,auVar128._0_32_);
      auVar101 = vmaxps_avx(auVar101,auVar109);
      auVar109 = vminps_avx(auVar45,auVar133._0_32_);
      auVar109 = vminps_avx(auVar9,auVar109);
      auVar101 = vcmpps_avx(auVar101,auVar109,2);
      uVar70 = vmovmskps_avx(auVar101);
      if (uVar70 == 0) {
        bVar85 = local_1698 != &local_1200;
        goto joined_r0x00426f87;
      }
      uVar70 = uVar70 & 0xff;
      uVar83 = uVar81 & 0xfffffffffffffff0;
      lVar69 = 0;
      if (uVar70 != 0) {
        for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
        }
      }
      uVar81 = *(ulong *)(uVar83 + lVar69 * 8);
      uVar70 = uVar70 - 1 & uVar70;
      if (uVar70 != 0) {
        *local_1698 = uVar81;
        local_1698 = local_1698 + 1;
        lVar69 = 0;
        if (uVar70 != 0) {
          for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
          }
        }
        uVar81 = *(ulong *)(uVar83 + lVar69 * 8);
        uVar70 = uVar70 - 1 & uVar70;
        uVar71 = (ulong)uVar70;
        if (uVar70 != 0) {
          do {
            *local_1698 = uVar81;
            local_1698 = local_1698 + 1;
            lVar69 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            uVar81 = *(ulong *)(uVar83 + lVar69 * 8);
            uVar71 = uVar71 & uVar71 - 1;
          } while (uVar71 != 0);
        }
      }
    }
    local_1660 = (ulong)((uint)uVar81 & 0xf) - 8;
    if (local_1660 != 0) {
      uVar81 = uVar81 & 0xfffffffffffffff0;
      local_1658 = 0;
      do {
        lVar69 = local_1658 * 0x90;
        local_1638 = uVar81 + lVar69;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = *(ulong *)(uVar81 + 0x40 + lVar69);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(uVar81 + 0x48 + lVar69);
        auVar87 = vpminub_avx(auVar98,auVar87);
        auVar87 = vpcmpeqb_avx(auVar98,auVar87);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)(uVar81 + 0x44 + lVar69);
        auVar114._8_8_ = 0;
        auVar114._0_8_ = *(ulong *)(uVar81 + 0x4c + lVar69);
        auVar98 = vpminub_avx(auVar99,auVar114);
        fVar92 = *(float *)(uVar81 + 0x70 + lVar69);
        auVar98 = vpcmpeqb_avx(auVar99,auVar98);
        fVar93 = *(float *)(uVar81 + 0x7c + lVar69);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(local_1668 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar107);
        auVar123._8_8_ = 0;
        auVar123._0_8_ = *(ulong *)(local_1668 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar123);
        auVar110._16_16_ = auVar107;
        auVar110._0_16_ = auVar99;
        auVar101 = vcvtdq2ps_avx(auVar110);
        auVar111._0_4_ = fVar92 + fVar93 * auVar101._0_4_;
        auVar111._4_4_ = fVar92 + fVar93 * auVar101._4_4_;
        auVar111._8_4_ = fVar92 + fVar93 * auVar101._8_4_;
        auVar111._12_4_ = fVar92 + fVar93 * auVar101._12_4_;
        auVar111._16_4_ = fVar92 + fVar93 * auVar101._16_4_;
        auVar111._20_4_ = fVar92 + fVar93 * auVar101._20_4_;
        auVar111._24_4_ = fVar92 + fVar93 * auVar101._24_4_;
        auVar111._28_4_ = fVar92 + auVar101._28_4_;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = *(ulong *)(local_1670 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar124);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = *(ulong *)(local_1670 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar129);
        auVar125._16_16_ = auVar107;
        auVar125._0_16_ = auVar99;
        auVar101 = vcvtdq2ps_avx(auVar125);
        fVar95 = *(float *)(uVar81 + 0x74 + lVar69);
        auVar115._0_4_ = fVar92 + fVar93 * auVar101._0_4_;
        auVar115._4_4_ = fVar92 + fVar93 * auVar101._4_4_;
        auVar115._8_4_ = fVar92 + fVar93 * auVar101._8_4_;
        auVar115._12_4_ = fVar92 + fVar93 * auVar101._12_4_;
        auVar115._16_4_ = fVar92 + fVar93 * auVar101._16_4_;
        auVar115._20_4_ = fVar92 + fVar93 * auVar101._20_4_;
        auVar115._24_4_ = fVar92 + fVar93 * auVar101._24_4_;
        auVar115._28_4_ = fVar92 + fVar93;
        fVar92 = *(float *)(uVar81 + 0x80 + lVar69);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)(local_1678 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar117);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)(local_1678 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar134);
        auVar119._16_16_ = auVar107;
        auVar119._0_16_ = auVar99;
        auVar101 = vcvtdq2ps_avx(auVar119);
        auVar120._0_4_ = fVar95 + fVar92 * auVar101._0_4_;
        auVar120._4_4_ = fVar95 + fVar92 * auVar101._4_4_;
        auVar120._8_4_ = fVar95 + fVar92 * auVar101._8_4_;
        auVar120._12_4_ = fVar95 + fVar92 * auVar101._12_4_;
        auVar120._16_4_ = fVar95 + fVar92 * auVar101._16_4_;
        auVar120._20_4_ = fVar95 + fVar92 * auVar101._20_4_;
        auVar120._24_4_ = fVar95 + fVar92 * auVar101._24_4_;
        auVar120._28_4_ = fVar95 + auVar101._28_4_;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(local_1680 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar135);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)(local_1680 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar140);
        auVar136._16_16_ = auVar107;
        auVar136._0_16_ = auVar99;
        auVar101 = vcvtdq2ps_avx(auVar136);
        fVar93 = *(float *)(uVar81 + 0x78 + lVar69);
        auVar126._0_4_ = fVar95 + fVar92 * auVar101._0_4_;
        auVar126._4_4_ = fVar95 + fVar92 * auVar101._4_4_;
        auVar126._8_4_ = fVar95 + fVar92 * auVar101._8_4_;
        auVar126._12_4_ = fVar95 + fVar92 * auVar101._12_4_;
        auVar126._16_4_ = fVar95 + fVar92 * auVar101._16_4_;
        auVar126._20_4_ = fVar95 + fVar92 * auVar101._20_4_;
        auVar126._24_4_ = fVar95 + fVar92 * auVar101._24_4_;
        auVar126._28_4_ = fVar95 + fVar92;
        fVar92 = *(float *)(uVar81 + 0x84 + lVar69);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = *(ulong *)(local_1688 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar141);
        auVar153._8_8_ = 0;
        auVar153._0_8_ = *(ulong *)(local_1688 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar153);
        auVar142._16_16_ = auVar107;
        auVar142._0_16_ = auVar99;
        auVar154._8_8_ = 0;
        auVar154._0_8_ = *(ulong *)(local_1690 + 0x40 + local_1638);
        auVar99 = vpmovzxbd_avx(auVar154);
        auVar171._8_8_ = 0;
        auVar171._0_8_ = *(ulong *)(local_1690 + 0x44 + local_1638);
        auVar107 = vpmovzxbd_avx(auVar171);
        auVar156._16_16_ = auVar107;
        auVar156._0_16_ = auVar99;
        auVar101 = vcvtdq2ps_avx(auVar142);
        auVar109 = vcvtdq2ps_avx(auVar156);
        auVar143._0_4_ = auVar101._0_4_ * fVar92 + fVar93;
        auVar143._4_4_ = auVar101._4_4_ * fVar92 + fVar93;
        auVar143._8_4_ = auVar101._8_4_ * fVar92 + fVar93;
        auVar143._12_4_ = auVar101._12_4_ * fVar92 + fVar93;
        auVar143._16_4_ = auVar101._16_4_ * fVar92 + fVar93;
        auVar143._20_4_ = auVar101._20_4_ * fVar92 + fVar93;
        auVar143._24_4_ = auVar101._24_4_ * fVar92 + fVar93;
        auVar143._28_4_ = auVar101._28_4_ + fVar93;
        auVar130._0_4_ = fVar93 + auVar109._0_4_ * fVar92;
        auVar130._4_4_ = fVar93 + auVar109._4_4_ * fVar92;
        auVar130._8_4_ = fVar93 + auVar109._8_4_ * fVar92;
        auVar130._12_4_ = fVar93 + auVar109._12_4_ * fVar92;
        auVar130._16_4_ = fVar93 + auVar109._16_4_ * fVar92;
        auVar130._20_4_ = fVar93 + auVar109._20_4_ * fVar92;
        auVar130._24_4_ = fVar93 + auVar109._24_4_ * fVar92;
        auVar130._28_4_ = fVar93 + fVar92;
        auVar101 = vsubps_avx(auVar111,auVar181._0_32_);
        auVar46._4_4_ = fVar193 * auVar101._4_4_;
        auVar46._0_4_ = fVar86 * auVar101._0_4_;
        auVar46._8_4_ = fVar194 * auVar101._8_4_;
        auVar46._12_4_ = fVar195 * auVar101._12_4_;
        auVar46._16_4_ = fVar196 * auVar101._16_4_;
        auVar46._20_4_ = fVar197 * auVar101._20_4_;
        auVar46._24_4_ = fVar198 * auVar101._24_4_;
        auVar46._28_4_ = auVar101._28_4_;
        auVar101 = vsubps_avx(auVar120,auVar189._0_32_);
        auVar47._4_4_ = fVar201 * auVar101._4_4_;
        auVar47._0_4_ = fVar91 * auVar101._0_4_;
        auVar47._8_4_ = fVar203 * auVar101._8_4_;
        auVar47._12_4_ = fVar205 * auVar101._12_4_;
        auVar47._16_4_ = fVar207 * auVar101._16_4_;
        auVar47._20_4_ = fVar209 * auVar101._20_4_;
        auVar47._24_4_ = fVar211 * auVar101._24_4_;
        auVar47._28_4_ = auVar101._28_4_;
        auVar101 = vmaxps_avx(auVar46,auVar47);
        auVar109 = vsubps_avx(auVar115,auVar181._0_32_);
        auVar48._4_4_ = fVar193 * auVar109._4_4_;
        auVar48._0_4_ = fVar86 * auVar109._0_4_;
        auVar48._8_4_ = fVar194 * auVar109._8_4_;
        auVar48._12_4_ = fVar195 * auVar109._12_4_;
        auVar48._16_4_ = fVar196 * auVar109._16_4_;
        auVar48._20_4_ = fVar197 * auVar109._20_4_;
        auVar48._24_4_ = fVar198 * auVar109._24_4_;
        auVar48._28_4_ = auVar109._28_4_;
        auVar109 = vsubps_avx(auVar126,auVar189._0_32_);
        auVar50._4_4_ = fVar201 * auVar109._4_4_;
        auVar50._0_4_ = fVar91 * auVar109._0_4_;
        auVar50._8_4_ = fVar203 * auVar109._8_4_;
        auVar50._12_4_ = fVar205 * auVar109._12_4_;
        auVar50._16_4_ = fVar207 * auVar109._16_4_;
        auVar50._20_4_ = fVar209 * auVar109._20_4_;
        auVar50._24_4_ = fVar211 * auVar109._24_4_;
        auVar50._28_4_ = auVar109._28_4_;
        auVar9 = vminps_avx(auVar48,auVar50);
        auVar109 = vsubps_avx(auVar143,auVar191._0_32_);
        auVar51._4_4_ = fStack_155c * auVar109._4_4_;
        auVar51._0_4_ = local_1560 * auVar109._0_4_;
        auVar51._8_4_ = fStack_1558 * auVar109._8_4_;
        auVar51._12_4_ = fStack_1554 * auVar109._12_4_;
        auVar51._16_4_ = fStack_1550 * auVar109._16_4_;
        auVar51._20_4_ = fStack_154c * auVar109._20_4_;
        auVar51._24_4_ = fStack_1548 * auVar109._24_4_;
        auVar51._28_4_ = auVar109._28_4_;
        auVar109 = vmaxps_avx(auVar51,local_1580);
        auVar101 = vmaxps_avx(auVar101,auVar109);
        auVar109 = vsubps_avx(auVar130,auVar191._0_32_);
        auVar52._4_4_ = fStack_155c * auVar109._4_4_;
        auVar52._0_4_ = local_1560 * auVar109._0_4_;
        auVar52._8_4_ = fStack_1558 * auVar109._8_4_;
        auVar52._12_4_ = fStack_1554 * auVar109._12_4_;
        auVar52._16_4_ = fStack_1550 * auVar109._16_4_;
        auVar52._20_4_ = fStack_154c * auVar109._20_4_;
        auVar52._24_4_ = fStack_1548 * auVar109._24_4_;
        auVar52._28_4_ = auVar109._28_4_;
        auVar109 = vminps_avx(auVar52,local_15a0);
        auVar109 = vminps_avx(auVar9,auVar109);
        auVar101 = vcmpps_avx(auVar101,auVar109,2);
        auVar99 = vpcmpeqd_avx(auVar109._0_16_,auVar109._0_16_);
        auVar87 = vpmovsxbd_avx(auVar87 ^ auVar99);
        auVar98 = vpmovsxbd_avx(auVar98 ^ auVar99);
        auVar88._16_16_ = auVar98;
        auVar88._0_16_ = auVar87;
        auVar109 = vcvtdq2ps_avx(auVar88);
        auVar102._8_4_ = 0xbf800000;
        auVar102._0_8_ = 0xbf800000bf800000;
        auVar102._12_4_ = 0xbf800000;
        auVar102._16_4_ = 0xbf800000;
        auVar102._20_4_ = 0xbf800000;
        auVar102._24_4_ = 0xbf800000;
        auVar102._28_4_ = 0xbf800000;
        auVar109 = vcmpps_avx(auVar102,auVar109,1);
        auVar101 = vandps_avx(auVar101,auVar109);
        uVar70 = vmovmskps_avx(auVar101);
        if (uVar70 != 0) {
          uVar72 = (ulong)(uVar70 & 0xff);
          do {
            lVar69 = 0;
            if (uVar72 != 0) {
              for (; (uVar72 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            uVar5 = *(ushort *)(local_1638 + lVar69 * 8);
            uVar6 = *(ushort *)(local_1638 + 2 + lVar69 * 8);
            local_1648 = (ulong)*(uint *)(local_1638 + 0x88);
            uVar70 = *(uint *)(local_1638 + 4 + lVar69 * 8);
            local_1650 = (ulong)uVar70;
            pGVar7 = (context->scene->geometries).items[local_1648].ptr;
            local_1640 = *(long *)&pGVar7->field_0x58;
            lVar74 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     local_1650;
            uVar75 = uVar5 & 0x7fff;
            uVar76 = uVar6 & 0x7fff;
            uVar152 = *(uint *)(local_1640 + 4 + lVar74);
            uVar79 = (ulong)uVar152;
            uVar78 = (ulong)(uVar152 * uVar76 + *(int *)(local_1640 + lVar74) + uVar75);
            p_Var8 = pGVar7[1].intersectionFilterN;
            lVar69 = *(long *)&pGVar7[1].time_range.upper;
            auVar87 = *(undefined1 (*) [16])(lVar69 + (long)p_Var8 * uVar78);
            auVar98 = *(undefined1 (*) [16])(lVar69 + (uVar78 + 1) * (long)p_Var8);
            auVar99 = *(undefined1 (*) [16])(lVar69 + (uVar78 + uVar79) * (long)p_Var8);
            lVar84 = uVar78 + uVar79 + 1;
            auVar107 = *(undefined1 (*) [16])(lVar69 + lVar84 * (long)p_Var8);
            uVar77 = (ulong)(-1 < (short)uVar5);
            auVar114 = *(undefined1 (*) [16])(lVar69 + (uVar78 + uVar77 + 1) * (long)p_Var8);
            lVar73 = uVar77 + lVar84;
            auVar117 = *(undefined1 (*) [16])(lVar69 + lVar73 * (long)p_Var8);
            uVar77 = 0;
            if (-1 < (short)uVar6) {
              uVar77 = uVar79;
            }
            auVar123 = *(undefined1 (*) [16])(lVar69 + (uVar78 + uVar79 + uVar77) * (long)p_Var8);
            auVar124 = *(undefined1 (*) [16])(lVar69 + (lVar84 + uVar77) * (long)p_Var8);
            auVar129 = *(undefined1 (*) [16])(lVar69 + (uVar77 + lVar73) * (long)p_Var8);
            auVar135 = vunpcklps_avx(auVar87,auVar107);
            auVar87 = vunpckhps_avx(auVar87,auVar107);
            auVar140 = vunpcklps_avx(auVar98,auVar99);
            auVar134 = vunpckhps_avx(auVar98,auVar99);
            auVar134 = vunpcklps_avx(auVar87,auVar134);
            auVar141 = vunpcklps_avx(auVar135,auVar140);
            auVar87 = vunpckhps_avx(auVar135,auVar140);
            auVar135 = vunpcklps_avx(auVar98,auVar117);
            auVar98 = vunpckhps_avx(auVar98,auVar117);
            auVar140 = vunpcklps_avx(auVar114,auVar107);
            auVar114 = vunpckhps_avx(auVar114,auVar107);
            auVar153 = vunpcklps_avx(auVar98,auVar114);
            auVar154 = vunpcklps_avx(auVar135,auVar140);
            auVar98 = vunpckhps_avx(auVar135,auVar140);
            auVar135 = vunpcklps_avx(auVar107,auVar129);
            auVar114 = vunpckhps_avx(auVar107,auVar129);
            auVar129 = vunpcklps_avx(auVar117,auVar124);
            auVar117 = vunpckhps_avx(auVar117,auVar124);
            auVar117 = vunpcklps_avx(auVar114,auVar117);
            auVar140 = vunpcklps_avx(auVar135,auVar129);
            auVar114 = vunpckhps_avx(auVar135,auVar129);
            auVar129 = vunpcklps_avx(auVar99,auVar124);
            auVar99 = vunpckhps_avx(auVar99,auVar124);
            auVar124 = vunpcklps_avx(auVar107,auVar123);
            auVar107 = vunpckhps_avx(auVar107,auVar123);
            auVar107 = vunpcklps_avx(auVar99,auVar107);
            auVar123 = vunpcklps_avx(auVar129,auVar124);
            auVar99 = vunpckhps_avx(auVar129,auVar124);
            auVar116._16_16_ = auVar140;
            auVar116._0_16_ = auVar141;
            auVar127._16_16_ = auVar114;
            auVar127._0_16_ = auVar87;
            auVar144._16_16_ = auVar117;
            auVar144._0_16_ = auVar134;
            auVar121._16_16_ = auVar154;
            auVar121._0_16_ = auVar154;
            auVar137._16_16_ = auVar98;
            auVar137._0_16_ = auVar98;
            auVar112._16_16_ = auVar153;
            auVar112._0_16_ = auVar153;
            auVar103._16_16_ = auVar123;
            auVar103._0_16_ = auVar123;
            auVar172._16_16_ = auVar99;
            auVar172._0_16_ = auVar99;
            auVar180._16_16_ = auVar107;
            auVar180._0_16_ = auVar107;
            auVar9 = vsubps_avx(auVar116,auVar121);
            auVar101 = vsubps_avx(auVar127,auVar137);
            auVar109 = vsubps_avx(auVar144,auVar112);
            auVar41 = vsubps_avx(auVar103,auVar116);
            auVar42 = vsubps_avx(auVar172,auVar127);
            auVar43 = vsubps_avx(auVar180,auVar144);
            fVar93 = auVar101._0_4_;
            fVar179 = auVar43._0_4_;
            fVar194 = auVar101._4_4_;
            fVar182 = auVar43._4_4_;
            auVar53._4_4_ = fVar182 * fVar194;
            auVar53._0_4_ = fVar179 * fVar93;
            fVar205 = auVar101._8_4_;
            fVar183 = auVar43._8_4_;
            auVar53._8_4_ = fVar183 * fVar205;
            fVar13 = auVar101._12_4_;
            fVar184 = auVar43._12_4_;
            auVar53._12_4_ = fVar184 * fVar13;
            fVar20 = auVar101._16_4_;
            fVar185 = auVar43._16_4_;
            auVar53._16_4_ = fVar185 * fVar20;
            fVar27 = auVar101._20_4_;
            fVar186 = auVar43._20_4_;
            auVar53._20_4_ = fVar186 * fVar27;
            fVar34 = auVar101._24_4_;
            fVar187 = auVar43._24_4_;
            auVar53._24_4_ = fVar187 * fVar34;
            auVar53._28_4_ = auVar123._12_4_;
            fVar95 = auVar109._0_4_;
            fVar170 = auVar42._0_4_;
            fVar195 = auVar109._4_4_;
            fVar173 = auVar42._4_4_;
            auVar55._4_4_ = fVar173 * fVar195;
            auVar55._0_4_ = fVar170 * fVar95;
            fVar207 = auVar109._8_4_;
            fVar174 = auVar42._8_4_;
            auVar55._8_4_ = fVar174 * fVar207;
            fVar14 = auVar109._12_4_;
            fVar175 = auVar42._12_4_;
            auVar55._12_4_ = fVar175 * fVar14;
            fVar21 = auVar109._16_4_;
            fVar176 = auVar42._16_4_;
            auVar55._16_4_ = fVar176 * fVar21;
            fVar28 = auVar109._20_4_;
            fVar177 = auVar42._20_4_;
            auVar55._20_4_ = fVar177 * fVar28;
            fVar35 = auVar109._24_4_;
            uVar54 = auVar153._12_4_;
            fVar178 = auVar42._24_4_;
            auVar55._24_4_ = fVar178 * fVar35;
            auVar55._28_4_ = uVar54;
            auVar44 = vsubps_avx(auVar55,auVar53);
            fVar151 = auVar41._0_4_;
            fVar157 = auVar41._4_4_;
            auVar56._4_4_ = fVar157 * fVar195;
            auVar56._0_4_ = fVar151 * fVar95;
            fVar159 = auVar41._8_4_;
            auVar56._8_4_ = fVar159 * fVar207;
            fVar161 = auVar41._12_4_;
            auVar56._12_4_ = fVar161 * fVar14;
            fVar163 = auVar41._16_4_;
            auVar56._16_4_ = fVar163 * fVar21;
            fVar165 = auVar41._20_4_;
            auVar56._20_4_ = fVar165 * fVar28;
            fVar167 = auVar41._24_4_;
            auVar56._24_4_ = fVar167 * fVar35;
            auVar56._28_4_ = uVar54;
            fVar97 = auVar9._0_4_;
            fVar196 = auVar9._4_4_;
            auVar58._4_4_ = fVar182 * fVar196;
            auVar58._0_4_ = fVar179 * fVar97;
            fVar209 = auVar9._8_4_;
            auVar58._8_4_ = fVar183 * fVar209;
            fVar15 = auVar9._12_4_;
            auVar58._12_4_ = fVar184 * fVar15;
            fVar22 = auVar9._16_4_;
            auVar58._16_4_ = fVar185 * fVar22;
            fVar29 = auVar9._20_4_;
            auVar58._20_4_ = fVar186 * fVar29;
            fVar36 = auVar9._24_4_;
            uVar57 = auVar154._12_4_;
            auVar58._24_4_ = fVar187 * fVar36;
            auVar58._28_4_ = uVar57;
            auVar45 = vsubps_avx(auVar58,auVar56);
            auVar59._4_4_ = fVar173 * fVar196;
            auVar59._0_4_ = fVar170 * fVar97;
            auVar59._8_4_ = fVar174 * fVar209;
            auVar59._12_4_ = fVar175 * fVar15;
            auVar59._16_4_ = fVar176 * fVar22;
            auVar59._20_4_ = fVar177 * fVar29;
            auVar59._24_4_ = fVar178 * fVar36;
            auVar59._28_4_ = uVar57;
            auVar188._0_4_ = fVar151 * fVar93;
            auVar188._4_4_ = fVar157 * fVar194;
            auVar188._8_4_ = fVar159 * fVar205;
            auVar188._12_4_ = fVar161 * fVar13;
            auVar188._16_4_ = fVar163 * fVar20;
            auVar188._20_4_ = fVar165 * fVar27;
            auVar188._24_4_ = fVar167 * fVar34;
            auVar188._28_4_ = 0;
            uVar1 = *(undefined4 *)(ray + k * 4);
            auVar190._4_4_ = uVar1;
            auVar190._0_4_ = uVar1;
            auVar190._8_4_ = uVar1;
            auVar190._12_4_ = uVar1;
            auVar190._16_4_ = uVar1;
            auVar190._20_4_ = uVar1;
            auVar190._24_4_ = uVar1;
            auVar190._28_4_ = uVar1;
            uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
            auVar192._4_4_ = uVar3;
            auVar192._0_4_ = uVar3;
            auVar192._8_4_ = uVar3;
            auVar192._12_4_ = uVar3;
            auVar192._16_4_ = uVar3;
            auVar192._20_4_ = uVar3;
            auVar192._24_4_ = uVar3;
            auVar192._28_4_ = uVar3;
            uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar200._4_4_ = uVar4;
            auVar200._0_4_ = uVar4;
            auVar200._8_4_ = uVar4;
            auVar200._12_4_ = uVar4;
            auVar200._16_4_ = uVar4;
            auVar200._20_4_ = uVar4;
            auVar200._24_4_ = uVar4;
            auVar200._28_4_ = uVar4;
            fVar86 = *(float *)(ray + k * 4 + 0x50);
            local_1540 = vsubps_avx(auVar188,auVar59);
            auVar46 = vsubps_avx(auVar116,auVar190);
            fVar91 = *(float *)(ray + k * 4 + 0x60);
            auVar101 = vsubps_avx(auVar127,auVar192);
            auVar109 = vsubps_avx(auVar144,auVar200);
            fVar139 = auVar109._0_4_;
            fVar145 = auVar109._4_4_;
            auVar60._4_4_ = fVar145 * fVar86;
            auVar60._0_4_ = fVar139 * fVar86;
            fVar146 = auVar109._8_4_;
            auVar60._8_4_ = fVar146 * fVar86;
            fVar147 = auVar109._12_4_;
            auVar60._12_4_ = fVar147 * fVar86;
            fVar148 = auVar109._16_4_;
            auVar60._16_4_ = fVar148 * fVar86;
            fVar149 = auVar109._20_4_;
            auVar60._20_4_ = fVar149 * fVar86;
            fVar150 = auVar109._24_4_;
            auVar60._24_4_ = fVar150 * fVar86;
            auVar60._28_4_ = uVar1;
            fVar94 = auVar101._0_4_;
            fVar197 = auVar101._4_4_;
            auVar61._4_4_ = fVar91 * fVar197;
            auVar61._0_4_ = fVar91 * fVar94;
            fVar211 = auVar101._8_4_;
            auVar61._8_4_ = fVar91 * fVar211;
            fVar16 = auVar101._12_4_;
            auVar61._12_4_ = fVar91 * fVar16;
            fVar23 = auVar101._16_4_;
            auVar61._16_4_ = fVar91 * fVar23;
            fVar30 = auVar101._20_4_;
            auVar61._20_4_ = fVar91 * fVar30;
            fVar37 = auVar101._24_4_;
            auVar61._24_4_ = fVar91 * fVar37;
            auVar61._28_4_ = uVar3;
            auVar47 = vsubps_avx(auVar61,auVar60);
            fVar92 = *(float *)(ray + k * 4 + 0x40);
            fVar96 = auVar46._0_4_;
            fVar198 = auVar46._4_4_;
            auVar62._4_4_ = fVar91 * fVar198;
            auVar62._0_4_ = fVar91 * fVar96;
            fVar10 = auVar46._8_4_;
            auVar62._8_4_ = fVar91 * fVar10;
            fVar17 = auVar46._12_4_;
            auVar62._12_4_ = fVar91 * fVar17;
            fVar24 = auVar46._16_4_;
            auVar62._16_4_ = fVar91 * fVar24;
            fVar31 = auVar46._20_4_;
            auVar62._20_4_ = fVar91 * fVar31;
            fVar38 = auVar46._24_4_;
            auVar62._24_4_ = fVar91 * fVar38;
            auVar62._28_4_ = uVar4;
            auVar63._4_4_ = fVar145 * fVar92;
            auVar63._0_4_ = fVar139 * fVar92;
            auVar63._8_4_ = fVar146 * fVar92;
            auVar63._12_4_ = fVar147 * fVar92;
            auVar63._16_4_ = fVar148 * fVar92;
            auVar63._20_4_ = fVar149 * fVar92;
            auVar63._24_4_ = fVar150 * fVar92;
            auVar63._28_4_ = uVar54;
            auVar109 = vsubps_avx(auVar63,auVar62);
            auVar64._4_4_ = fVar92 * fVar197;
            auVar64._0_4_ = fVar92 * fVar94;
            auVar64._8_4_ = fVar92 * fVar211;
            auVar64._12_4_ = fVar92 * fVar16;
            auVar64._16_4_ = fVar92 * fVar23;
            auVar64._20_4_ = fVar92 * fVar30;
            auVar64._24_4_ = fVar92 * fVar37;
            auVar64._28_4_ = uVar4;
            auVar65._4_4_ = fVar198 * fVar86;
            auVar65._0_4_ = fVar96 * fVar86;
            auVar65._8_4_ = fVar10 * fVar86;
            auVar65._12_4_ = fVar17 * fVar86;
            auVar65._16_4_ = fVar24 * fVar86;
            auVar65._20_4_ = fVar31 * fVar86;
            auVar65._24_4_ = fVar38 * fVar86;
            auVar65._28_4_ = uVar57;
            auVar48 = vsubps_avx(auVar65,auVar64);
            fVar90 = local_1540._0_4_;
            fVar201 = local_1540._4_4_;
            fVar11 = local_1540._8_4_;
            fVar18 = local_1540._12_4_;
            fVar25 = local_1540._16_4_;
            fVar32 = local_1540._20_4_;
            fVar39 = local_1540._24_4_;
            fVar199 = auVar45._0_4_;
            fVar202 = auVar45._4_4_;
            fVar204 = auVar45._8_4_;
            fVar206 = auVar45._12_4_;
            fVar208 = auVar45._16_4_;
            fVar210 = auVar45._20_4_;
            fVar212 = auVar45._24_4_;
            fVar193 = auVar44._0_4_;
            fVar203 = auVar44._4_4_;
            fVar12 = auVar44._8_4_;
            fVar19 = auVar44._12_4_;
            fVar26 = auVar44._16_4_;
            fVar33 = auVar44._20_4_;
            fVar40 = auVar44._24_4_;
            auVar104._0_4_ = fVar92 * fVar193 + fVar91 * fVar90 + fVar199 * fVar86;
            auVar104._4_4_ = fVar92 * fVar203 + fVar91 * fVar201 + fVar202 * fVar86;
            auVar104._8_4_ = fVar92 * fVar12 + fVar91 * fVar11 + fVar204 * fVar86;
            auVar104._12_4_ = fVar92 * fVar19 + fVar91 * fVar18 + fVar206 * fVar86;
            auVar104._16_4_ = fVar92 * fVar26 + fVar91 * fVar25 + fVar208 * fVar86;
            auVar104._20_4_ = fVar92 * fVar33 + fVar91 * fVar32 + fVar210 * fVar86;
            auVar104._24_4_ = fVar92 * fVar40 + fVar91 * fVar39 + fVar212 * fVar86;
            auVar104._28_4_ = fVar91 + fVar91 + fVar86;
            auVar122._8_4_ = 0x80000000;
            auVar122._0_8_ = 0x8000000080000000;
            auVar122._12_4_ = 0x80000000;
            auVar122._16_4_ = 0x80000000;
            auVar122._20_4_ = 0x80000000;
            auVar122._24_4_ = 0x80000000;
            auVar122._28_4_ = 0x80000000;
            auVar101 = vandps_avx(auVar104,auVar122);
            uVar152 = auVar101._0_4_;
            auVar131._0_4_ =
                 (float)(uVar152 ^
                        (uint)(fVar151 * auVar47._0_4_ +
                              fVar179 * auVar48._0_4_ + fVar170 * auVar109._0_4_));
            uVar158 = auVar101._4_4_;
            auVar131._4_4_ =
                 (float)(uVar158 ^
                        (uint)(fVar157 * auVar47._4_4_ +
                              fVar182 * auVar48._4_4_ + fVar173 * auVar109._4_4_));
            uVar160 = auVar101._8_4_;
            auVar131._8_4_ =
                 (float)(uVar160 ^
                        (uint)(fVar159 * auVar47._8_4_ +
                              fVar183 * auVar48._8_4_ + fVar174 * auVar109._8_4_));
            uVar162 = auVar101._12_4_;
            auVar131._12_4_ =
                 (float)(uVar162 ^
                        (uint)(fVar161 * auVar47._12_4_ +
                              fVar184 * auVar48._12_4_ + fVar175 * auVar109._12_4_));
            uVar164 = auVar101._16_4_;
            auVar131._16_4_ =
                 (float)(uVar164 ^
                        (uint)(fVar163 * auVar47._16_4_ +
                              fVar185 * auVar48._16_4_ + fVar176 * auVar109._16_4_));
            uVar166 = auVar101._20_4_;
            auVar131._20_4_ =
                 (float)(uVar166 ^
                        (uint)(fVar165 * auVar47._20_4_ +
                              fVar186 * auVar48._20_4_ + fVar177 * auVar109._20_4_));
            uVar168 = auVar101._24_4_;
            auVar131._24_4_ =
                 (float)(uVar168 ^
                        (uint)(fVar167 * auVar47._24_4_ +
                              fVar187 * auVar48._24_4_ + fVar178 * auVar109._24_4_));
            uVar169 = auVar101._28_4_;
            auVar131._28_4_ =
                 (float)(uVar169 ^ (uint)(auVar41._28_4_ + auVar43._28_4_ + auVar42._28_4_));
            auVar138._0_4_ =
                 (float)(uVar152 ^
                        (uint)(auVar47._0_4_ * fVar97 +
                              fVar95 * auVar48._0_4_ + fVar93 * auVar109._0_4_));
            auVar138._4_4_ =
                 (float)(uVar158 ^
                        (uint)(auVar47._4_4_ * fVar196 +
                              fVar195 * auVar48._4_4_ + fVar194 * auVar109._4_4_));
            auVar138._8_4_ =
                 (float)(uVar160 ^
                        (uint)(auVar47._8_4_ * fVar209 +
                              fVar207 * auVar48._8_4_ + fVar205 * auVar109._8_4_));
            auVar138._12_4_ =
                 (float)(uVar162 ^
                        (uint)(auVar47._12_4_ * fVar15 +
                              fVar14 * auVar48._12_4_ + fVar13 * auVar109._12_4_));
            auVar138._16_4_ =
                 (float)(uVar164 ^
                        (uint)(auVar47._16_4_ * fVar22 +
                              fVar21 * auVar48._16_4_ + fVar20 * auVar109._16_4_));
            auVar138._20_4_ =
                 (float)(uVar166 ^
                        (uint)(auVar47._20_4_ * fVar29 +
                              fVar28 * auVar48._20_4_ + fVar27 * auVar109._20_4_));
            auVar138._24_4_ =
                 (float)(uVar168 ^
                        (uint)(auVar47._24_4_ * fVar36 +
                              fVar35 * auVar48._24_4_ + fVar34 * auVar109._24_4_));
            auVar138._28_4_ =
                 (float)(uVar169 ^ (uint)(auVar44._28_4_ + auVar48._28_4_ + auVar109._28_4_));
            auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar101 = vcmpps_avx(auVar131,auVar109,5);
            auVar109 = vcmpps_avx(auVar138,auVar109,5);
            auVar101 = vandps_avx(auVar101,auVar109);
            auVar89._8_4_ = 0x7fffffff;
            auVar89._0_8_ = 0x7fffffff7fffffff;
            auVar89._12_4_ = 0x7fffffff;
            auVar89._16_4_ = 0x7fffffff;
            auVar89._20_4_ = 0x7fffffff;
            auVar89._24_4_ = 0x7fffffff;
            auVar89._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(auVar104,auVar89);
            auVar109 = vcmpps_avx(auVar104,ZEXT1232(ZEXT812(0)) << 0x20,4);
            auVar101 = vandps_avx(auVar101,auVar109);
            auVar105._0_4_ = auVar131._0_4_ + auVar138._0_4_;
            auVar105._4_4_ = auVar131._4_4_ + auVar138._4_4_;
            auVar105._8_4_ = auVar131._8_4_ + auVar138._8_4_;
            auVar105._12_4_ = auVar131._12_4_ + auVar138._12_4_;
            auVar105._16_4_ = auVar131._16_4_ + auVar138._16_4_;
            auVar105._20_4_ = auVar131._20_4_ + auVar138._20_4_;
            auVar105._24_4_ = auVar131._24_4_ + auVar138._24_4_;
            auVar105._28_4_ = auVar131._28_4_ + auVar138._28_4_;
            auVar109 = vcmpps_avx(auVar105,local_1320,2);
            auVar41 = auVar109 & auVar101;
            if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0x7f,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0xbf,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar41[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar101,auVar109);
              auVar87 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
              local_1340._0_4_ =
                   (float)(uVar152 ^ (uint)(fVar193 * fVar96 + fVar199 * fVar94 + fVar139 * fVar90))
              ;
              local_1340._4_4_ =
                   (float)(uVar158 ^
                          (uint)(fVar203 * fVar198 + fVar202 * fVar197 + fVar145 * fVar201));
              local_1340._8_4_ =
                   (float)(uVar160 ^ (uint)(fVar12 * fVar10 + fVar204 * fVar211 + fVar146 * fVar11))
              ;
              local_1340._12_4_ =
                   (float)(uVar162 ^ (uint)(fVar19 * fVar17 + fVar206 * fVar16 + fVar147 * fVar18));
              local_1340._16_4_ =
                   (float)(uVar164 ^ (uint)(fVar26 * fVar24 + fVar208 * fVar23 + fVar148 * fVar25));
              local_1340._20_4_ =
                   (float)(uVar166 ^ (uint)(fVar33 * fVar31 + fVar210 * fVar30 + fVar149 * fVar32));
              local_1340._24_4_ =
                   (float)(uVar168 ^ (uint)(fVar40 * fVar38 + fVar212 * fVar37 + fVar150 * fVar39));
              local_1340._28_4_ = uVar169 ^ (uint)(auVar46._28_4_ + 0.0);
              fVar86 = *(float *)(ray + k * 4 + 0x30);
              fVar91 = local_1320._0_4_;
              fVar92 = local_1320._4_4_;
              auVar66._4_4_ = fVar92 * fVar86;
              auVar66._0_4_ = fVar91 * fVar86;
              fVar93 = local_1320._8_4_;
              auVar66._8_4_ = fVar93 * fVar86;
              fVar95 = local_1320._12_4_;
              auVar66._12_4_ = fVar95 * fVar86;
              fVar97 = local_1320._16_4_;
              auVar66._16_4_ = fVar97 * fVar86;
              fVar94 = local_1320._20_4_;
              auVar66._20_4_ = fVar94 * fVar86;
              fVar96 = local_1320._24_4_;
              auVar66._24_4_ = fVar96 * fVar86;
              auVar66._28_4_ = fVar86;
              auVar101 = vcmpps_avx(auVar66,local_1340,1);
              local_1480 = *(float *)(ray + k * 4 + 0x80);
              auVar67._4_4_ = local_1480 * fVar92;
              auVar67._0_4_ = local_1480 * fVar91;
              auVar67._8_4_ = local_1480 * fVar93;
              auVar67._12_4_ = local_1480 * fVar95;
              auVar67._16_4_ = local_1480 * fVar97;
              auVar67._20_4_ = local_1480 * fVar94;
              auVar67._24_4_ = local_1480 * fVar96;
              auVar67._28_4_ = 0;
              auVar109 = vcmpps_avx(local_1340,auVar67,2);
              auVar101 = vandps_avx(auVar101,auVar109);
              auVar98 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
              auVar87 = vpand_avx(auVar98,auVar87);
              auVar98 = vpmovzxwd_avx(auVar87);
              auVar98 = vpslld_avx(auVar98,0x1f);
              auVar99 = vpsrad_avx(auVar98,0x1f);
              auVar98 = vpunpckhwd_avx(auVar87,auVar87);
              auVar98 = vpslld_avx(auVar98,0x1f);
              auVar98 = vpsrad_avx(auVar98,0x1f);
              local_12e0._16_16_ = auVar98;
              local_12e0._0_16_ = auVar99;
              if ((((((((local_12e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_12e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_12e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_12e0 >> 0x7f,0) != '\0') ||
                    (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar98 >> 0x3f,0) != '\0') ||
                  (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0xf] < '\0') {
                auVar101 = vsubps_avx(local_1320,auVar138);
                auVar101 = vblendvps_avx(auVar131,auVar101,local_1440);
                auVar41 = vsubps_avx(local_1320,auVar131);
                auVar109 = vblendvps_avx(auVar138,auVar41,local_1440);
                uStack_1244 = auVar41._28_4_;
                local_1260[0] = fVar193 * (float)local_1460._0_4_;
                local_1260[1] = fVar203 * (float)local_1460._4_4_;
                local_1260[2] = fVar12 * fStack_1458;
                local_1260[3] = fVar19 * fStack_1454;
                fStack_1250 = fVar26 * fStack_1450;
                fStack_124c = fVar33 * fStack_144c;
                fStack_1248 = fVar40 * fStack_1448;
                local_1240[0] = fVar199 * (float)local_1460._0_4_;
                local_1240[1] = fVar202 * (float)local_1460._4_4_;
                local_1240[2] = fVar204 * fStack_1458;
                local_1240[3] = fVar206 * fStack_1454;
                fStack_1230 = fVar208 * fStack_1450;
                fStack_122c = fVar210 * fStack_144c;
                fStack_1228 = fVar212 * fStack_1448;
                uStack_1224 = uStack_1244;
                local_1220[0] = (float)local_1460._0_4_ * fVar90;
                local_1220[1] = (float)local_1460._4_4_ * fVar201;
                local_1220[2] = fStack_1458 * fVar11;
                local_1220[3] = fStack_1454 * fVar18;
                fStack_1210 = fStack_1450 * fVar25;
                fStack_120c = fStack_144c * fVar32;
                fStack_1208 = fStack_1448 * fVar39;
                uStack_1204 = uStack_1244;
                auVar98 = vpshufd_avx(ZEXT416(uVar75),0);
                auVar98 = vpaddd_avx(auVar98,_DAT_01fab9b0);
                auVar99 = vpshufd_avx(ZEXT416(uVar76),0);
                auVar99 = vpaddd_avx(auVar99,_DAT_01fab9c0);
                auVar118._0_4_ = (float)(int)(*(ushort *)(local_1640 + 8 + lVar74) - 1);
                auVar118._4_12_ = auVar47._4_12_;
                auVar107 = vrcpss_avx(auVar118,auVar118);
                auVar155._0_4_ = (float)(int)(*(ushort *)(local_1640 + 10 + lVar74) - 1);
                auVar155._4_12_ = auVar47._4_12_;
                auVar114 = vrcpss_avx(auVar155,auVar155);
                auVar106._16_16_ = auVar98;
                auVar106._0_16_ = auVar98;
                auVar41 = vcvtdq2ps_avx(auVar106);
                fStack_1364 = auVar101._28_4_ + auVar41._28_4_;
                auVar98 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - auVar107._0_4_ * auVar118._0_4_)));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                local_1380 = (auVar101._0_4_ + fVar91 * auVar41._0_4_) * auVar98._0_4_;
                fStack_137c = (auVar101._4_4_ + fVar92 * auVar41._4_4_) * auVar98._4_4_;
                fStack_1378 = (auVar101._8_4_ + fVar93 * auVar41._8_4_) * auVar98._8_4_;
                fStack_1374 = (auVar101._12_4_ + fVar95 * auVar41._12_4_) * auVar98._12_4_;
                fStack_1370 = (auVar101._16_4_ + fVar97 * auVar41._16_4_) * auVar98._0_4_;
                fStack_136c = (auVar101._20_4_ + fVar94 * auVar41._20_4_) * auVar98._4_4_;
                fStack_1368 = (auVar101._24_4_ + fVar96 * auVar41._24_4_) * auVar98._8_4_;
                auVar113._16_16_ = auVar99;
                auVar113._0_16_ = auVar99;
                auVar101 = vcvtdq2ps_avx(auVar113);
                fStack_1344 = auVar101._28_4_ + auVar109._28_4_;
                auVar98 = ZEXT416((uint)((2.0 - auVar155._0_4_ * auVar114._0_4_) * auVar114._0_4_));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                local_1360 = (fVar91 * auVar101._0_4_ + auVar109._0_4_) * auVar98._0_4_;
                fStack_135c = (fVar92 * auVar101._4_4_ + auVar109._4_4_) * auVar98._4_4_;
                fStack_1358 = (fVar93 * auVar101._8_4_ + auVar109._8_4_) * auVar98._8_4_;
                fStack_1354 = (fVar95 * auVar101._12_4_ + auVar109._12_4_) * auVar98._12_4_;
                fStack_1350 = (fVar97 * auVar101._16_4_ + auVar109._16_4_) * auVar98._0_4_;
                fStack_134c = (fVar94 * auVar101._20_4_ + auVar109._20_4_) * auVar98._4_4_;
                fStack_1348 = (fVar96 * auVar101._24_4_ + auVar109._24_4_) * auVar98._8_4_;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00427ab1:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar85;
                  }
                  auVar101 = vrcpps_avx(local_1320);
                  fVar86 = auVar101._0_4_;
                  fVar90 = auVar101._4_4_;
                  auVar68._4_4_ = fVar92 * fVar90;
                  auVar68._0_4_ = fVar91 * fVar86;
                  fVar91 = auVar101._8_4_;
                  auVar68._8_4_ = fVar93 * fVar91;
                  fVar92 = auVar101._12_4_;
                  auVar68._12_4_ = fVar95 * fVar92;
                  fVar93 = auVar101._16_4_;
                  auVar68._16_4_ = fVar97 * fVar93;
                  fVar95 = auVar101._20_4_;
                  auVar68._20_4_ = fVar94 * fVar95;
                  fVar97 = auVar101._24_4_;
                  auVar68._24_4_ = fVar96 * fVar97;
                  auVar68._28_4_ = local_1320._28_4_;
                  auVar132._8_4_ = 0x3f800000;
                  auVar132._0_8_ = 0x3f8000003f800000;
                  auVar132._12_4_ = 0x3f800000;
                  auVar132._16_4_ = 0x3f800000;
                  auVar132._20_4_ = 0x3f800000;
                  auVar132._24_4_ = 0x3f800000;
                  auVar132._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar132,auVar68);
                  fVar86 = fVar86 + fVar86 * auVar109._0_4_;
                  fVar90 = fVar90 + fVar90 * auVar109._4_4_;
                  fVar91 = fVar91 + fVar91 * auVar109._8_4_;
                  fVar92 = fVar92 + fVar92 * auVar109._12_4_;
                  fVar93 = fVar93 + fVar93 * auVar109._16_4_;
                  fVar95 = fVar95 + fVar95 * auVar109._20_4_;
                  fVar97 = fVar97 + fVar97 * auVar109._24_4_;
                  local_1280[0] = fVar86 * local_1340._0_4_;
                  local_1280[1] = fVar90 * local_1340._4_4_;
                  local_1280[2] = fVar91 * local_1340._8_4_;
                  local_1280[3] = fVar92 * local_1340._12_4_;
                  fStack_1270 = fVar93 * local_1340._16_4_;
                  fStack_126c = fVar95 * local_1340._20_4_;
                  fStack_1268 = fVar97 * local_1340._24_4_;
                  uStack_1264 = local_1340._28_4_;
                  local_12c0[0] = local_1380 * fVar86;
                  local_12c0[1] = fStack_137c * fVar90;
                  local_12c0[2] = fStack_1378 * fVar91;
                  local_12c0[3] = fStack_1374 * fVar92;
                  fStack_12b0 = fStack_1370 * fVar93;
                  fStack_12ac = fStack_136c * fVar95;
                  fStack_12a8 = fStack_1368 * fVar97;
                  fStack_12a4 = fStack_1364;
                  local_12a0[0] = local_1360 * fVar86;
                  local_12a0[1] = fStack_135c * fVar90;
                  local_12a0[2] = fStack_1358 * fVar91;
                  local_12a0[3] = fStack_1354 * fVar92;
                  fStack_1290 = fStack_1350 * fVar93;
                  fStack_128c = fStack_134c * fVar95;
                  fStack_1288 = fStack_1348 * fVar97;
                  fStack_1284 = auVar101._28_4_ + auVar109._28_4_;
                  auVar87 = vpsllw_avx(auVar87,0xf);
                  auVar87 = vpacksswb_avx(auVar87,auVar87);
                  bVar49 = SUB161(auVar87 >> 7,0) & 1 | (SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                           (SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                           (SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                           (SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                           (SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                           (SUB161(auVar87 >> 0x37,0) & 1) << 6 | SUB161(auVar87 >> 0x3f,0) << 7;
                  uVar78 = (ulong)bVar49;
                  uVar77 = 0;
                  if (uVar78 != 0) {
                    for (; (bVar49 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
                    }
                  }
                  if (bVar49 != 0) {
                    local_15c0 = vpshufd_avx(ZEXT416(*(uint *)(local_1638 + 0x88)),0);
                    auStack_15b0 = auVar9._16_16_;
                    local_15e0 = vpshufd_avx(ZEXT416(uVar70),0);
                    auStack_15d0 = auVar44._16_16_;
                    auStack_15f0 = auVar45._16_16_;
                    local_1600 = *local_16d0;
                    fStack_147c = local_1480;
                    fStack_1478 = local_1480;
                    fStack_1474 = local_1480;
                    fStack_1470 = local_1480;
                    fStack_146c = local_1480;
                    fStack_1468 = local_1480;
                    fStack_1464 = local_1480;
                    do {
                      local_14e0 = local_12c0[uVar77];
                      local_14d0 = local_12a0[uVar77];
                      *(float *)(ray + k * 4 + 0x80) = local_1280[uVar77];
                      local_1630.context = context->user;
                      local_1510 = local_1260[uVar77];
                      local_1500 = local_1240[uVar77];
                      local_14f0 = local_1220[uVar77];
                      local_14c0 = local_15e0._0_8_;
                      uStack_14b8 = local_15e0._8_8_;
                      local_14b0 = local_15c0;
                      vcmpps_avx(ZEXT1632(local_15c0),ZEXT1632(local_15c0),0xf);
                      uStack_149c = (local_1630.context)->instID[0];
                      local_14a0 = uStack_149c;
                      uStack_1498 = uStack_149c;
                      uStack_1494 = uStack_149c;
                      uStack_1490 = (local_1630.context)->instPrimID[0];
                      uStack_148c = uStack_1490;
                      uStack_1488 = uStack_1490;
                      uStack_1484 = uStack_1490;
                      local_16e0 = local_1600;
                      local_1630.valid = (int *)local_16e0;
                      local_1630.geometryUserPtr = pGVar7->userPtr;
                      local_1630.hit = (RTCHitN *)&local_1510;
                      local_1630.N = 4;
                      local_1630.ray = (RTCRayN *)ray;
                      fStack_150c = local_1510;
                      fStack_1508 = local_1510;
                      fStack_1504 = local_1510;
                      fStack_14fc = local_1500;
                      fStack_14f8 = local_1500;
                      fStack_14f4 = local_1500;
                      fStack_14ec = local_14f0;
                      fStack_14e8 = local_14f0;
                      fStack_14e4 = local_14f0;
                      fStack_14dc = local_14e0;
                      fStack_14d8 = local_14e0;
                      fStack_14d4 = local_14e0;
                      fStack_14cc = local_14d0;
                      fStack_14c8 = local_14d0;
                      fStack_14c4 = local_14d0;
                      if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar7->occlusionFilterN)(&local_1630);
                      }
                      if (local_16e0 == (undefined1  [16])0x0) {
                        auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar87 = auVar87 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&local_1630);
                        }
                        auVar98 = vpcmpeqd_avx(local_16e0,_DAT_01f7aa10);
                        auVar87 = auVar98 ^ _DAT_01f7ae20;
                        auVar108._8_4_ = 0xff800000;
                        auVar108._0_8_ = 0xff800000ff800000;
                        auVar108._12_4_ = 0xff800000;
                        auVar98 = vblendvps_avx(auVar108,*(undefined1 (*) [16])
                                                          (local_1630.ray + 0x80),auVar98);
                        *(undefined1 (*) [16])(local_1630.ray + 0x80) = auVar98;
                      }
                      auVar100._8_8_ = 0x100000001;
                      auVar100._0_8_ = 0x100000001;
                      if ((auVar100 & auVar87) != (undefined1  [16])0x0) goto LAB_00427ab1;
                      *(float *)(ray + k * 4 + 0x80) = local_1480;
                      uVar78 = uVar78 ^ 1L << (uVar77 & 0x3f);
                      uVar77 = 0;
                      if (uVar78 != 0) {
                        for (; (uVar78 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
                        }
                      }
                    } while (uVar78 != 0);
                  }
                }
              }
            }
            uVar72 = uVar72 & uVar72 - 1;
          } while (uVar72 != 0);
        }
        local_1658 = local_1658 + 1;
        auVar181 = ZEXT3264(local_13a0);
        auVar189 = ZEXT3264(local_13c0);
        auVar191 = ZEXT3264(local_13e0);
        fVar86 = local_1400;
        fVar193 = fStack_13fc;
        fVar194 = fStack_13f8;
        fVar195 = fStack_13f4;
        fVar196 = fStack_13f0;
        fVar197 = fStack_13ec;
        fVar198 = fStack_13e8;
        fVar91 = local_1420;
        fVar201 = fStack_141c;
        fVar203 = fStack_1418;
        fVar205 = fStack_1414;
        fVar207 = fStack_1410;
        fVar209 = fStack_140c;
        fVar211 = fStack_1408;
      } while (local_1658 != local_1660);
    }
    bVar85 = local_1698 != &local_1200;
    auVar128 = ZEXT3264(local_1580);
    auVar133 = ZEXT3264(local_15a0);
    uVar72 = local_16c0;
    uVar77 = local_16a0;
    uVar78 = local_16a8;
    uVar79 = local_16b0;
    uVar80 = local_16b8;
    uVar82 = local_16c8;
    fVar92 = local_1560;
    fVar93 = fStack_155c;
    fVar95 = fStack_1558;
    fVar97 = fStack_1554;
    fVar94 = fStack_1550;
    fVar96 = fStack_154c;
    fVar90 = fStack_1548;
joined_r0x00426f87:
    if (!bVar85) {
      return bVar85;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }